

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *__s;
  CommandOptions local_228;
  CommandOptions local_1c0;
  CommandOptions local_158;
  undefined4 local_f0;
  undefined1 local_e0 [8];
  CommandOptions Options;
  Result_t result;
  char **argv_local;
  int argc_local;
  
  Kumu::Result_t::Result_t((Result_t *)&Options.chunk_count,(Result_t *)Kumu::RESULT_FAIL);
  CommandOptions::CommandOptions((CommandOptions *)local_e0,argc,argv);
  if ((Options.order._1_1_ & 1) != 0) {
    banner(_stdout);
  }
  if ((Options.order._2_1_ & 1) != 0) {
    usage(_stdout);
  }
  if (((Options.order._1_1_ & 1) == 0) && ((Options.order._2_1_ & 1) == 0)) {
    if ((local_e0[0] & 1U) == 0) {
      if (Options.write_filename.field_2._12_4_ == 1) {
        CreateLargeFile(&local_158);
        Kumu::Result_t::operator=((Result_t *)&Options.chunk_count,(Result_t *)&local_158);
        Kumu::Result_t::~Result_t((Result_t *)&local_158);
      }
      else if (Options.write_filename.field_2._12_4_ == 2) {
        ValidateLargeFile(&local_1c0);
        Kumu::Result_t::operator=((Result_t *)&Options.chunk_count,(Result_t *)&local_1c0);
        Kumu::Result_t::~Result_t((Result_t *)&local_1c0);
      }
      else if (Options.write_filename.field_2._12_4_ == 3) {
        ReadValidateWriteLargeFile(&local_228);
        Kumu::Result_t::operator=((Result_t *)&Options.chunk_count,(Result_t *)&local_228);
        Kumu::Result_t::~Result_t((Result_t *)&local_228);
      }
      bVar1 = Kumu::Result_t::operator!=
                        ((Result_t *)&Options.chunk_count,(Result_t *)Kumu::RESULT_OK);
      if (bVar1) {
        fputs("Program stopped on error.\n",_stderr);
        bVar1 = Kumu::Result_t::operator!=
                          ((Result_t *)&Options.chunk_count,(Result_t *)Kumu::RESULT_FAIL);
        if (bVar1) {
          __s = Kumu::Result_t::Label((Result_t *)&Options.chunk_count);
          fputs(__s,_stderr);
          fputc(10,_stderr);
        }
        argv_local._4_4_ = 1;
      }
      else {
        argv_local._4_4_ = 0;
      }
    }
    else {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
      argv_local._4_4_ = 3;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  local_f0 = 1;
  CommandOptions::~CommandOptions((CommandOptions *)local_e0);
  Kumu::Result_t::~Result_t((Result_t *)&Options.chunk_count);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, const char **argv)
{
  Result_t result = RESULT_FAIL;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  switch ( Options.mode )
    {

    case MMT_CREATE:
      result = CreateLargeFile(Options);
      break;

    case MMT_VALIDATE:
      result = ValidateLargeFile(Options);
      break;

    case MMT_VAL_WRITE:
      result = ReadValidateWriteLargeFile(Options);
      break;
    }

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result.Label(), stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}